

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O2

int write_proc(void)

{
  int v;
  int iVar1;
  
  while (g_index <= g_maxCount) {
    for (iVar1 = -0x32; v = g_index, iVar1 != 0; iVar1 = iVar1 + 1) {
      g_index = g_index + 1;
      spsc_queue<int>::enqueue(&q,v);
    }
    usleep(1);
  }
  return 0;
}

Assistant:

int write_proc()
{

    while( g_index <= g_maxCount)
    {
	int step = rand_step(); 
	Log( " enqueue "<< step<< " to queue " ); 
	while(step  > 0)
	{
	    step--; 

	    {
		q.enqueue(g_index++); 
	    }
	}
	usleep(1); 
    }
    Log(" write finished " ); 

    return 0; 

}